

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O0

string * GetAutogenTargetDir_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *target)

{
  char *pcVar1;
  string local_58;
  allocator local_22;
  undefined1 local_21;
  cmMakefile *local_20;
  cmMakefile *makefile;
  cmGeneratorTarget *target_local;
  string *targetDir;
  
  makefile = (cmMakefile *)target;
  target_local = (cmGeneratorTarget *)__return_storage_ptr__;
  local_20 = cmTarget::GetMakefile(target->Target);
  local_21 = 0;
  pcVar1 = cmMakefile::GetCurrentBinaryDirectory(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  cmMakefile::GetCMakeInstance(local_20);
  pcVar1 = cmake::GetCMakeFilesDirectory();
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  GetAutogenTargetName_abi_cxx11_(&local_58,(cmGeneratorTarget *)makefile);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".dir/");
  return __return_storage_ptr__;
}

Assistant:

std::string GetAutogenTargetDir(
    cmGeneratorTarget const* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();
  std::string targetDir = makefile->GetCurrentBinaryDirectory();
  targetDir += makefile->GetCMakeInstance()->GetCMakeFilesDirectory();
  targetDir += "/";
  targetDir += GetAutogenTargetName(target);
  targetDir += ".dir/";
  return targetDir;
}